

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateTable
          (DuckSchemaEntry *this,CatalogTransaction transaction,BoundCreateTableInfo *info)

{
  LogicalDependencyList *pLVar1;
  OnCreateConflict on_conflict;
  Catalog *catalog;
  CatalogTransaction transaction_00;
  BoundCreateTableInfo *pBVar2;
  DuckTableEntry *this_00;
  type table_00;
  reference this_01;
  type pAVar3;
  create_info_set_t *pcVar4;
  pointer pDVar5;
  pointer pCVar6;
  optional_ptr<duckdb::CatalogEntry,_true> oVar7;
  size_type __n;
  __node_base *p_Var8;
  templated_unique_single_t table;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
  fk_arrays;
  __alloc_node_gen_t __alloc_node_gen;
  _Head_base<0UL,_duckdb::DuckTableEntry_*,_false> local_d8;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_d0;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  local_c8;
  BoundCreateTableInfo *local_a8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,_true>_>_> local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  transaction_t local_78;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  catalog = (this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog;
  this_00 = (DuckTableEntry *)operator_new(0x298);
  local_c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = info;
  DuckTableEntry::DuckTableEntry
            (this_00,catalog,&this->super_SchemaCatalogEntry,info,
             (shared_ptr<duckdb::DataTable,_true> *)&local_c8);
  local_d8._M_head_impl = this_00;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c8.
      super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c8.
               super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  table_00 = unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>::
             operator*((unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>
                        *)&local_d8);
  FindForeignKeyInformation
            (&table_00->super_TableCatalogEntry,AFT_ADD,
             (vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
              *)&local_c8);
  if (local_c8.
      super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_c8.
      super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pLVar1 = &local_a8->dependencies;
    __n = 0;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                              *)&local_c8,__n);
      pAVar3 = unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>
               ::operator*(this_01);
      (*(this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [0x20])(this,pAVar3);
      local_a0._M_h =
           (__hashtable_alloc *)
           CatalogSet::GetEntry
                     (&this->tables,transaction,&(pAVar3->super_AlterTableInfo).super_AlterInfo.name
                     );
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_a0);
      LogicalDependencyList::AddDependency(pLVar1,(CatalogEntry *)local_a0._M_h);
      __n = __n + 1;
    } while (__n < (ulong)((long)local_c8.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_c8.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pLVar1 = &local_a8->dependencies;
  pcVar4 = LogicalDependencyList::Set(pLVar1);
  p_Var8 = &(pcVar4->_M_h)._M_before_begin;
  while (pBVar2 = local_a8, local_d0._M_head_impl = (StandardEntry *)local_d8._M_head_impl,
        p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    pDVar5 = unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>::
             operator->((unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>
                         *)&local_d8);
    LogicalDependencyList::AddDependency
              (&(pDVar5->super_TableCatalogEntry).super_StandardEntry.dependencies,
               (LogicalDependency *)(p_Var8 + 1));
  }
  local_78 = transaction.start_time;
  local_98 = transaction.db.ptr._0_4_;
  uStack_94 = transaction.db.ptr._4_4_;
  uStack_90 = transaction.context.ptr._0_4_;
  uStack_8c = transaction.context.ptr._4_4_;
  local_88 = transaction.transaction.ptr._0_4_;
  uStack_84 = transaction.transaction.ptr._4_4_;
  uStack_80 = (undefined4)transaction.transaction_id;
  uStack_7c = transaction.transaction_id._4_4_;
  local_d8._M_head_impl = (DuckTableEntry *)0x0;
  pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&local_a8->base);
  on_conflict = pCVar6->on_conflict;
  local_a0._M_h = (__hashtable_alloc *)&local_68;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = (pBVar2->dependencies).set._M_h._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = (pBVar2->dependencies).set._M_h._M_element_count;
  local_68._M_rehash_policy._M_max_load_factor =
       (pBVar2->dependencies).set._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pBVar2->dependencies).set._M_h._M_rehash_policy.field_0x4;
  local_68._M_rehash_policy._M_next_resize =
       (pBVar2->dependencies).set._M_h._M_rehash_policy._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalDependency,true>>>>
            ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_a0._M_h,
             (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)pLVar1,&local_a0);
  transaction_00.db.ptr._4_4_ = uStack_94;
  transaction_00.db.ptr._0_4_ = local_98;
  transaction_00.context.ptr._0_4_ = uStack_90;
  transaction_00.context.ptr._4_4_ = uStack_8c;
  transaction_00.transaction.ptr._0_4_ = local_88;
  transaction_00.transaction.ptr._4_4_ = uStack_84;
  transaction_00.transaction_id._0_4_ = uStack_80;
  transaction_00.transaction_id._4_4_ = uStack_7c;
  transaction_00.start_time = local_78;
  oVar7 = AddEntryInternal(this,transaction_00,
                           (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                            *)&local_d0,on_conflict,(LogicalDependencyList *)&local_68);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if ((DuckTableEntry *)local_d0._M_head_impl != (DuckTableEntry *)0x0) {
    (*(((TableCatalogEntry *)&(local_d0._M_head_impl)->super_InCatalogEntry)->super_StandardEntry).
      super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_d0._M_head_impl = (StandardEntry *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ::~vector(&local_c8);
  if (local_d8._M_head_impl != (DuckTableEntry *)0x0) {
    (*((local_d8._M_head_impl)->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar7.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateTable(CatalogTransaction transaction, BoundCreateTableInfo &info) {
	auto table = make_uniq<DuckTableEntry>(catalog, *this, info);

	// add a foreign key constraint in main key table if there is a foreign key constraint
	vector<unique_ptr<AlterForeignKeyInfo>> fk_arrays;
	FindForeignKeyInformation(*table, AlterForeignKeyType::AFT_ADD, fk_arrays);
	for (idx_t i = 0; i < fk_arrays.size(); i++) {
		// alter primary key table
		auto &fk_info = *fk_arrays[i];
		Alter(transaction, fk_info);

		// make a dependency between this table and referenced table
		auto &set = GetCatalogSet(CatalogType::TABLE_ENTRY);
		info.dependencies.AddDependency(*set.GetEntry(transaction, fk_info.name));
	}
	for (auto &dep : info.dependencies.Set()) {
		table->dependencies.AddDependency(dep);
	}

	auto entry = AddEntryInternal(transaction, std::move(table), info.Base().on_conflict, info.dependencies);
	if (!entry) {
		return nullptr;
	}

	return entry;
}